

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiStreamParser.cpp
# Opt level: O1

Bit32u __thiscall
MT32Emu::MidiStreamParserImpl::parseShortMessageStatus(MidiStreamParserImpl *this,Bit8u *stream)

{
  byte bVar1;
  Bit32u BVar2;
  byte bVar3;
  
  bVar1 = *stream;
  if ((char)bVar1 < '\0') {
    if (bVar1 < 0xf0) {
      this->runningStatus = bVar1;
    }
    else if (bVar1 < 0xf8) {
      this->runningStatus = '\0';
    }
  }
  else {
    bVar3 = this->runningStatus;
    if ((char)bVar3 < '\0') {
      BVar2 = 0;
      goto LAB_0017857c;
    }
    (**this->midiReporter->_vptr_MidiReporter)
              (this->midiReporter,
               "processStatusByte: No valid running status yet, MIDI message ignored");
  }
  BVar2 = 1;
  bVar3 = bVar1;
LAB_0017857c:
  if ((char)bVar3 < '\0') {
    *this->streamBuffer = bVar3;
    this->streamBufferSize = this->streamBufferSize + 1;
  }
  return BVar2;
}

Assistant:

Bit32u MidiStreamParserImpl::parseShortMessageStatus(const Bit8u stream[]) {
	Bit8u status = *stream;
	Bit32u parsedLength = processStatusByte(status) ? 0 : 1;
	if (0x80 <= status) { // If no running status available yet, skip one byte
		*streamBuffer = status;
		++streamBufferSize;
	}
	return parsedLength;
}